

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O0

Sto_Man_t * Sto_ManAlloc(void)

{
  Sto_Man_t *__s;
  Sto_Man_t *p;
  
  __s = (Sto_Man_t *)malloc(0x38);
  memset(__s,0,0x38);
  __s->nChunkSize = 0x10000;
  return __s;
}

Assistant:

Sto_Man_t * Sto_ManAlloc()
{
    Sto_Man_t * p;
    // allocate the manager
    p = (Sto_Man_t *)ABC_ALLOC( char, sizeof(Sto_Man_t) );
    memset( p, 0, sizeof(Sto_Man_t) );
    // memory management
    p->nChunkSize = (1<<16); // use 64K chunks
    return p;    
}